

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

int Gla_ManGetVar(Gla_Man_t *p,int iObj,int iFrame)

{
  Vec_Int_t *p_00;
  int Entry;
  Gla_Obj_t *pGVar1;
  int Fill;
  
  pGVar1 = Gla_ManObj(p,iObj);
  p_00 = &pGVar1->vFrames;
  Entry = Vec_IntGetEntry(p_00,iFrame);
  if ((pGVar1->field_0x4 & 0x50) == 0) {
    if (Entry == 0) {
      Entry = p->nSatVars;
      p->nSatVars = Entry + 1;
      Vec_IntFillExtra(p_00,iFrame + 1,Fill);
      Vec_IntWriteEntry(p_00,iFrame,Entry);
      Vec_IntPush(p->vAddedNew,iObj);
      Vec_IntPush(p->vAddedNew,iFrame);
    }
    return Entry;
  }
  __assert_fail("!pGla->fPo && !pGla->fRi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                ,0x51d,"int Gla_ManGetVar(Gla_Man_t *, int, int)");
}

Assistant:

int Gla_ManGetVar( Gla_Man_t * p, int iObj, int iFrame )
{
    Gla_Obj_t * pGla = Gla_ManObj( p, iObj );
    int iVar = Vec_IntGetEntry( &pGla->vFrames, iFrame );
    assert( !pGla->fPo && !pGla->fRi );
    if ( iVar == 0 )
    {
        Vec_IntSetEntry( &pGla->vFrames, iFrame, (iVar = p->nSatVars++) );
        // remember the change
        Vec_IntPush( p->vAddedNew, iObj );
        Vec_IntPush( p->vAddedNew, iFrame );
    }
    return iVar;
}